

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::FloatDatatypeValidator::checkContent
          (FloatDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  DatatypeValidator *pDVar1;
  RefVectorOf<xercesc_4_0::XMLNumber> *pRVar2;
  XMLSize_t XVar3;
  bool bVar4;
  int iVar5;
  XMLNumber *pXVar6;
  InvalidDatatypeValueException *pIVar7;
  XMLSize_t getAt;
  XMLSize_t XVar8;
  XMLFloat theValue;
  XMLFloat local_68;
  
  pDVar1 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
           super_DatatypeValidator.fBaseValidator;
  if (pDVar1 != (DatatypeValidator *)0x0) {
    (*(pDVar1->super_XSerializable)._vptr_XSerializable[0x11])(pDVar1,content,context,1,manager);
  }
  if ((((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
        super_DatatypeValidator.fFacetsDefined & 8) != 0) &&
     (bVar4 = RegularExpression::matches
                        ((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                         super_DatatypeValidator.fRegex,content,manager), !bVar4)) {
    pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (pIVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/FloatDatatypeValidator.cpp"
               ,0xc4,VALUE_NotMatch_Pattern,content,
               (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
               super_DatatypeValidator.fPattern,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
  }
  if (!asBase) {
    XMLFloat::XMLFloat(&local_68,content,manager);
    pRVar2 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumeration
    ;
    if (pRVar2 != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      XVar3 = (pRVar2->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>).fCurCount;
      getAt = 0;
      XVar8 = getAt;
      if (XVar3 != 0) {
        do {
          pXVar6 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt
                             (&((this->super_AbstractNumericValidator).
                                super_AbstractNumericFacetValidator.fEnumeration)->
                               super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,getAt);
          iVar5 = (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                    super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x10])
                            (this,&local_68,pXVar6);
          XVar8 = getAt;
          if (iVar5 == 0) break;
          getAt = getAt + 1;
          XVar8 = XVar3;
        } while (XVar3 != getAt);
      }
      if (XVar8 == XVar3) {
        pIVar7 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/FloatDatatypeValidator.cpp"
                   ,0xdb,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar7,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    AbstractNumericValidator::boundsCheck
              (&this->super_AbstractNumericValidator,(XMLNumber *)&local_68,manager);
    XMLFloat::~XMLFloat(&local_68);
  }
  return;
}

Assistant:

void FloatDatatypeValidator::checkContent(const XMLCh*             const content
                                         ,      ValidationContext* const context
                                         ,      bool                     asBase
                                         ,      MemoryManager*     const manager)
{

    //validate against base validator if any
    FloatDatatypeValidator *pBase = (FloatDatatypeValidator*) this->getBaseValidator();
    if (pBase)
        pBase->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    XMLFloat theValue(content, manager);
    XMLFloat *theData = &theValue;

    if (getEnumeration() != 0)
    {
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (compareValues(theData, (XMLFloat*) getEnumeration()->elementAt(i))==0)
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }

    boundsCheck(theData, manager);
}